

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

precise_unit units::localityModifiers(string *unit,uint64_t match_flags)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  size_t sVar6;
  size_type sVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  const_iterator ppcVar8;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  undefined1 uVar9;
  precise_unit pVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> nunit;
  value_type *seq;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  array<const_char_*,_7UL> *__range1_1;
  precise_unit retunit;
  size_t len;
  size_type fnd;
  value_type *irep;
  const_iterator __end1;
  const_iterator __begin1;
  array<std::pair<const_char_*,_const_char_*>,_62UL> *__range1;
  bool changed;
  uint64_t in_stack_00000d18;
  string *in_stack_00000d20;
  undefined7 in_stack_fffffffffffffdf8;
  byte in_stack_fffffffffffffdff;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  string *in_stack_fffffffffffffe08;
  string *in_stack_fffffffffffffe10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  char __c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  __const_iterator in_stack_fffffffffffffe28;
  string *in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  allocator<char> local_161 [9];
  uint64_t in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb0;
  const_iterator local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  precise_unit local_c0;
  size_t local_b0;
  size_type local_a8;
  allocator<char> local_89 [65];
  const_iterator local_48;
  const_iterator local_40;
  const_iterator local_38;
  array<std::pair<const_char_*,_const_char_*>,_62UL> *local_30;
  undefined7 in_stack_ffffffffffffffd8;
  byte bVar11;
  precise_unit local_10;
  
  sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (in_RDI);
  if (sVar4 < 3) {
    local_10.base_units_ = (unit_data)0xfa94a488;
    local_10.commodity_ = 0;
    local_10.multiplier_ = NAN;
  }
  else {
    pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                       (in_stack_fffffffffffffe00);
    if ((*pvVar5 == 'u') &&
       ((pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator[](in_stack_fffffffffffffe00,
                             CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8)),
        *pvVar5 == 'S' ||
        (pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator[](in_stack_fffffffffffffe00,
                             CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8)),
        *pvVar5 == 'K')))) {
      pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               front(in_stack_fffffffffffffe00);
      *pvVar5 = 'U';
    }
    bVar11 = 0;
    local_30 = &localityModifiers::internationlReplacements;
    local_38 = std::array<std::pair<const_char_*,_const_char_*>,_62UL>::begin
                         ((array<std::pair<const_char_*,_const_char_*>,_62UL> *)0x7a2d4a);
    local_40 = std::array<std::pair<const_char_*,_const_char_*>,_62UL>::end
                         ((array<std::pair<const_char_*,_const_char_*>,_62UL> *)0x7a2d5e);
    for (; local_38 != local_40; local_38 = local_38 + 1) {
      local_48 = local_38;
      sVar6 = strlen(local_38->first);
      if (sVar6 == 2) {
        iVar3 = strncmp(local_48->first,local_48->second,2);
        if (iVar3 != 0) {
LAB_007a2edf:
          pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   operator[](in_stack_fffffffffffffe00,
                              CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
          if ('\0' < *pvVar5) {
            pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::operator[](in_stack_fffffffffffffe00,
                                  CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
            iVar3 = isupper((int)*pvVar5);
            if (iVar3 != 0) {
              pvVar5 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                                 (in_stack_fffffffffffffe00,
                                  CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
              iVar3 = toupper((int)*pvVar5);
              if ((iVar3 == *local_48->first) &&
                 (pvVar5 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                           operator[](in_stack_fffffffffffffe00,
                                      CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8))
                 , *pvVar5 == local_48->first[1])) {
                pvVar5 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                         operator[](in_stack_fffffffffffffe00,
                                    CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
                iVar3 = toupper((int)*pvVar5);
                pvVar5 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                         operator[](in_stack_fffffffffffffe00,
                                    CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
                *pvVar5 = (value_type)iVar3;
              }
            }
          }
          goto LAB_007a2f93;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18,
                   (char)((ulong)in_stack_fffffffffffffe10 >> 0x38),
                   (allocator<char> *)in_stack_fffffffffffffe08);
        std::operator+(in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00);
        bVar1 = ends_with(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        std::__cxx11::string::~string(in_stack_fffffffffffffe00);
        std::__cxx11::string::~string(in_stack_fffffffffffffe00);
        std::allocator<char>::~allocator(local_89);
        if (!bVar1) goto LAB_007a2edf;
      }
      else {
LAB_007a2f93:
        local_a8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   find(in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18,
                        (size_type)in_stack_fffffffffffffe10);
        if (local_a8 != 0xffffffffffffffff) {
          sVar6 = strlen(local_48->first);
          local_b0 = sVar6;
          sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size(in_RDI);
          if (sVar6 == sVar4) {
            local_10.base_units_ = (unit_data)0xfa94a488;
            local_10.commodity_ = 0;
            local_10.multiplier_ = NAN;
            return local_10;
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                    (in_stack_fffffffffffffe10,(size_type)in_stack_fffffffffffffe08,
                     (size_type)in_stack_fffffffffffffe00);
          if ((local_a8 != 0) &&
             (pvVar5 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                                 (in_stack_fffffffffffffe00,
                                  CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8)),
             *pvVar5 == '_')) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                      (in_stack_fffffffffffffe10,(size_type)in_stack_fffffffffffffe08,
                       (size_type)in_stack_fffffffffffffe00);
          }
          sVar4 = local_a8;
          sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size(in_RDI);
          if ((sVar4 < sVar7) &&
             (pvVar5 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                                 (in_stack_fffffffffffffe00,
                                  CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8)),
             *pvVar5 == '_')) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                      (in_stack_fffffffffffffe10,(size_type)in_stack_fffffffffffffe08,
                       (size_type)in_stack_fffffffffffffe00);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (in_stack_fffffffffffffe10,(char)((ulong)in_stack_fffffffffffffe08 >> 0x38));
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08);
          bVar11 = 1;
          break;
        }
      }
    }
    bVar2 = clearEmptySegments(in_stack_fffffffffffffe30);
    bVar1 = (bVar11 & 1) != 0;
    uVar9 = bVar1 || bVar2;
    if (bVar1 || bVar2) {
      __str = &local_e0;
      std::__cxx11::string::string(in_stack_fffffffffffffe40,__str);
      local_c0 = unit_from_string_internal(in_stack_00000d20,in_stack_00000d18);
      this = local_c0._8_8_;
      std::__cxx11::string::~string(in_stack_fffffffffffffe00);
      bVar1 = is_error((precise_unit *)in_stack_fffffffffffffe10);
      if ((bVar1) && (((ulong)in_RSI & 0x400000) == 0)) {
        std::__cxx11::string::string(this,__str);
        local_10 = localityModifiers(in_RSI,CONCAT17(uVar9,in_stack_ffffffffffffffd8));
        std::__cxx11::string::~string(in_stack_fffffffffffffe00);
      }
      else {
        local_10 = local_c0;
      }
    }
    else {
      sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        (in_RDI);
      if (sVar4 < 4) {
        local_10.base_units_ = (unit_data)0xfa94a488;
        local_10.commodity_ = 0;
        local_10.multiplier_ = NAN;
      }
      else {
        local_110 = std::array<const_char_*,_7UL>::begin((array<const_char_*,_7UL> *)0x7a3317);
        ppcVar8 = std::array<const_char_*,_7UL>::end((array<const_char_*,_7UL> *)0x7a332b);
        for (; local_110 != ppcVar8; local_110 = local_110 + 1) {
          iVar3 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffe30,
                             (size_type)in_stack_fffffffffffffe28._M_current,
                             (size_type)in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18)
          ;
          if (iVar3 == 0) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator[](in_stack_fffffffffffffe00,
                       CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      (in_stack_fffffffffffffe18,(size_type)in_stack_fffffffffffffe10,
                       (size_type)in_stack_fffffffffffffe08);
            pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::back(in_stack_fffffffffffffe00);
            if (*pvVar5 == 's') {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              pop_back(in_stack_fffffffffffffe00);
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back(in_stack_fffffffffffffe10,(char)((ulong)in_stack_fffffffffffffe08 >> 0x38));
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08);
            pVar10 = get_unit((string *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
            std::__cxx11::string::~string(in_stack_fffffffffffffe00);
            return pVar10;
          }
          in_stack_fffffffffffffe00 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*local_110;
          in_stack_fffffffffffffe08 = (string *)local_161;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                     (allocator<char> *)in_stack_fffffffffffffe30);
          in_stack_fffffffffffffdff = ends_with(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08)
          ;
          std::__cxx11::string::~string(in_stack_fffffffffffffe00);
          std::allocator<char>::~allocator(local_161);
          if ((in_stack_fffffffffffffdff & 1) != 0) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                      (in_stack_fffffffffffffe08);
            __c = (char)((ulong)in_stack_fffffffffffffe18 >> 0x38);
            __gnu_cxx::
            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator-((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)in_stack_fffffffffffffe08,(difference_type)in_stack_fffffffffffffe00);
            __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffe00,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,__c);
            pVar10 = get_unit((string *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
            return pVar10;
          }
        }
        local_10.base_units_ = (unit_data)0xfa94a488;
        local_10.commodity_ = 0;
        local_10.multiplier_ = NAN;
      }
    }
  }
  return local_10;
}

Assistant:

static precise_unit
    localityModifiers(std::string unit, std::uint64_t match_flags)
{
    static UNITS_CPP14_CONSTEXPR_OBJECT std::array<ckpair, 62>
        internationlReplacements{{
            ckpair{"internationaltable", "IT"},
            ckpair{"internationalsteamtable", "IT"},
            ckpair{"international", "i"},
            ckpair{"USandBritish", "av"},
            ckpair{"US&British", "av"},
            ckpair{"USAsurvey", "US"},
            ckpair{"USsurvey", "US"},
            ckpair{"USSurvey", "US"},
            ckpair{"USdry", "US"},
            ckpair{"USA", "US"},
            ckpair{"USstatute", "US"},
            ckpair{"statutory", "US"},
            ckpair{"statute", "US"},
            ckpair{"US", "US"},
            ckpair{"shipping", "ship"},
            ckpair{"gregorian", "g"},
            ckpair{"Gregorian", "g"},
            ckpair{"synodic", "s"},
            ckpair{"sidereal", "sdr"},
            ckpair{"julian", "j"},
            ckpair{"Julian", "j"},
            ckpair{"thermochemical", "th"},
            ckpair{"hydraulic", "mech"},
            ckpair{"Th", "th"},
            ckpair{"(th)", "th"},
            ckpair{"metric", "m"},
            ckpair{"mean", "m"},
            ckpair{"imperial", "br"},
            ckpair{"Imperial", "br"},
            ckpair{"English", "br"},
            ckpair{"imp", "br"},
            ckpair{"wine", "wine"},
            ckpair{"beer", "wine"},
            ckpair{"(IT)", "IT"},
            ckpair{"troy", "tr"},
            ckpair{"apothecary", "ap"},
            ckpair{"apothecaries", "ap"},
            ckpair{"avoirdupois", "av"},
            ckpair{"Chinese", "cn"},
            ckpair{"chinese", "cn"},
            ckpair{"Canadian", "ca"},
            ckpair{"canadian", "ca"},
            ckpair{"survey", "US"},
            ckpair{"tropical", "t"},
            ckpair{"British", "br"},
            ckpair{"british", "br"},
            ckpair{"Br", "br"},
            ckpair{"BR", "br"},
            ckpair{"UK", "br"},
            ckpair{"conventional", "90"},
            ckpair{"AC", "ac"},
            ckpair{"DC", "dc"},
            ckpair{"fluid", "FL"},
            ckpair{"liquid", "FL"},
            ckpair{"fl", "FL"},
            ckpair{"15degC", "[15]"},
            ckpair{"20degC", "[20]"},
            ckpair{"59degF", "[59]"},
            ckpair{"60degF", "[60]"},
            ckpair{"39degF", "[39]"},
            ckpair{"0degC", "[00]"},
            // this should be last

            ckpair{"us", "US"},
        }};
    if (unit.size() < 3) {
        return precise::invalid;
    }
    if (unit.front() == 'u' && (unit[1] == 'S' || unit[1] == 'K')) {
        unit.front() = 'U';
    }
    bool changed = false;
    for (const auto& irep : internationlReplacements) {
        if (strlen(irep.first) == 2) {
            if (strncmp(irep.first, irep.second, 2) == 0) {
                if (ends_with(unit, std::string(1, '_') + irep.second)) {
                    continue;
                }
            }
            if (unit[1] > 0 && (std::isupper(unit[1]) != 0) &&
                (std::toupper(unit[0]) == irep.first[0]) &&
                (unit[1] == irep.first[1])) {
                unit[0] = std::toupper(unit[0]);
            }
        }
        auto fnd = unit.find(irep.first);
        if (fnd != std::string::npos) {
            auto len = strlen(irep.first);
            if (len == unit.size()) {  // this is a modifier if we are checking
                                       // the entire unit this is automatically
                                       // false
                return precise::invalid;
            }
            unit.erase(fnd, len);
            if (fnd > 0 && unit[fnd - 1] == '_') {
                unit.erase(fnd - 1, 1);
            }
            if (fnd < unit.size() && unit[fnd] == '_') {
                unit.erase(fnd, 1);
            }
            unit.push_back('_');
            unit.append(irep.second);
            changed = true;
            break;
        }
    }
    changed |= clearEmptySegments(unit);
    if (changed) {
        auto retunit = unit_from_string_internal(
            unit, match_flags | no_locality_modifiers | no_of_operator);
        if (is_error(retunit) && ((match_flags & no_locality_modifiers) == 0)) {
            return localityModifiers(unit, match_flags | no_locality_modifiers);
        }
        return retunit;
    }
    if (unit.size() < 4) {
        return precise::invalid;
    }
    static constexpr std::array<const char*, 7> rotSequences{
        {"br", "av", "ch", "IT", "th", "ap", "tr"}};
    for (const auto& seq : rotSequences) {
        if (unit.compare(0, 2, seq) == 0) {
            auto nunit = unit.substr((unit[3] == '_') ? 3 : 2);
            if (nunit.back() == 's') {
                nunit.pop_back();
            }
            nunit.push_back('_');
            nunit.append(seq);
            return get_unit(nunit, match_flags);
        }
        if (ends_with(unit, seq)) {
            unit.insert(unit.end() - 2, '_');
            return get_unit(unit, match_flags);
        }
    }

    return precise::invalid;
}